

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

int covscript_args(int args_size,char **args)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  string *str;
  long in_RSI;
  int in_EDI;
  int index;
  int expect_stack_resize;
  int expect_import_path;
  int expect_log_path;
  int expect_csym;
  string *in_stack_fffffffffffffde8;
  process_context *in_stack_fffffffffffffdf0;
  fatal_error *this;
  undefined8 in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe48;
  undefined1 local_1a1 [40];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  for (local_24 = 1; local_24 < local_8; local_24 = local_24 + 1) {
    if (local_14 == 1) {
      in_stack_fffffffffffffe48 = *(string **)(local_10 + (long)local_24 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,(char *)in_stack_fffffffffffffe48,&local_69);
      cs::process_path(in_stack_fffffffffffffe48);
      std::__cxx11::string::operator=((string *)&csym_path_abi_cxx11_,local_48);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      local_14 = 2;
    }
    else if (local_18 == 1) {
      pcVar1 = *(char **)(local_10 + (long)local_24 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
      cs::process_path(in_stack_fffffffffffffe48);
      std::__cxx11::string::operator=((string *)&log_path_abi_cxx11_,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      local_18 = 2;
    }
    else if (local_1c == 1) {
      pcVar1 = *(char **)(local_10 + (long)local_24 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,pcVar1,&local_129);
      cs::process_path(in_stack_fffffffffffffe48);
      std::operator+((char)((ulong)in_stack_fffffffffffffdf8 >> 0x38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdf0);
      std::__cxx11::string::operator+=((string *)(cs::current_process + 0x58),local_e8);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      local_1c = 2;
    }
    else if (local_20 == 1) {
      pcVar1 = *(char **)(local_10 + (long)local_24 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar1,&local_151);
      std::__cxx11::stoul((string *)in_stack_fffffffffffffdf0,(size_t *)in_stack_fffffffffffffde8,0)
      ;
      cs::process_context::resize_stack(in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8)
      ;
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      local_20 = 2;
    }
    else {
      if (**(char **)(local_10 + (long)local_24 * 8) != '-') break;
      iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--args");
      if ((iVar2 == 0) ||
         (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-a"), iVar2 == 0)) {
        repl = true;
        return local_24 + 1;
      }
      iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--silent");
      if (((iVar2 == 0) ||
          (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-s"), iVar2 == 0)) &&
         ((silent & 1U) == 0)) {
        silent = true;
      }
      else {
        iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--dump-ast");
        if (((iVar2 == 0) ||
            (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-d"), iVar2 == 0)) &&
           ((dump_ast & 1U) == 0)) {
          dump_ast = true;
        }
        else {
          iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--dependency");
          if (((iVar2 == 0) ||
              (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-r"), iVar2 == 0)) &&
             ((dump_dependency & 1U) == 0)) {
            dump_dependency = true;
          }
          else {
            iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--no-optimize");
            if (((iVar2 == 0) ||
                (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-o"), iVar2 == 0)) &&
               ((no_optimize & 1U) == 0)) {
              no_optimize = true;
            }
            else {
              iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--compile-only");
              if (((iVar2 == 0) ||
                  (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-c"), iVar2 == 0)) &&
                 ((compile_only & 1U) == 0)) {
                compile_only = true;
              }
              else {
                iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--help");
                if (((iVar2 == 0) ||
                    (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-h"), iVar2 == 0)) &&
                   ((show_help_info & 1U) == 0)) {
                  show_help_info = true;
                }
                else {
                  iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--wait-before-exit");
                  if (((iVar2 == 0) ||
                      (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-w"), iVar2 == 0))
                     && ((wait_before_exit & 1U) == 0)) {
                    wait_before_exit = true;
                  }
                  else {
                    iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--version");
                    if (((iVar2 == 0) ||
                        (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-v"), iVar2 == 0)
                        ) && ((show_version_info & 1U) == 0)) {
                      show_version_info = true;
                    }
                    else {
                      iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--csym");
                      if (((iVar2 == 0) ||
                          (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-g"),
                          iVar2 == 0)) && (local_14 == 0)) {
                        local_14 = 1;
                      }
                      else {
                        iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--log-path");
                        if (((iVar2 == 0) ||
                            (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-l"),
                            iVar2 == 0)) && (local_18 == 0)) {
                          local_18 = 1;
                        }
                        else {
                          iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"--import-path");
                          if (((iVar2 == 0) ||
                              (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-i"),
                              iVar2 == 0)) && (local_1c == 0)) {
                            local_1c = 1;
                          }
                          else {
                            iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),
                                           "--stack-resize");
                            if (((iVar2 != 0) &&
                                (iVar2 = strcmp(*(char **)(local_10 + (long)local_24 * 8),"-S"),
                                iVar2 != 0)) || (local_20 != 0)) {
                              local_1a1[0x27] = '\x01';
                              uVar3 = __cxa_allocate_exception(0x28);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_178,"argument syntax error.",&local_179);
                              cs::fatal_error::fatal_error
                                        ((fatal_error *)in_stack_fffffffffffffdf0,
                                         in_stack_fffffffffffffde8);
                              local_1a1[0x27] = '\0';
                              __cxa_throw(uVar3,&cs::fatal_error::typeinfo,
                                          cs::fatal_error::~fatal_error);
                            }
                            local_20 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((((local_14 != 1) && (local_18 != 1)) && (local_1c != 1)) && (local_1c != 1)) {
    return local_24;
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this = (fatal_error *)local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a1 + 1),"argument syntax error.",(allocator *)this)
  ;
  cs::fatal_error::fatal_error(this,str);
  __cxa_throw(str,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
}

Assistant:

int covscript_args(int args_size, char *args[])
{
	int expect_csym = 0;
	int expect_log_path = 0;
	int expect_import_path = 0;
	int expect_stack_resize = 0;
	int index = 1;
	for (; index < args_size; ++index) {
		if (expect_csym == 1) {
			csym_path = cs::process_path(args[index]);
			expect_csym = 2;
		}
		else if (expect_log_path == 1) {
			log_path = cs::process_path(args[index]);
			expect_log_path = 2;
		}
		else if (expect_import_path == 1) {
			cs::current_process->import_path += cs::path_delimiter + cs::process_path(args[index]);
			expect_import_path = 2;
		}
		else if (expect_stack_resize == 1) {
			cs::current_process->resize_stack(std::stoul(args[index]));
			expect_stack_resize = 2;
		}
		else if (args[index][0] == '-') {
			if (std::strcmp(args[index], "--args") == 0 || std::strcmp(args[index], "-a") == 0) {
				repl = true;
				return ++index;
			}
			else if ((std::strcmp(args[index], "--silent") == 0 || std::strcmp(args[index], "-s") == 0) && !silent)
				silent = true;
			else if ((std::strcmp(args[index], "--dump-ast") == 0 || std::strcmp(args[index], "-d") == 0) && !dump_ast)
				dump_ast = true;
			else if ((std::strcmp(args[index], "--dependency") == 0 || std::strcmp(args[index], "-r") == 0) &&
			         !dump_dependency)
				dump_dependency = true;
			else if ((std::strcmp(args[index], "--no-optimize") == 0 || std::strcmp(args[index], "-o") == 0) &&
			         !no_optimize)
				no_optimize = true;
			else if ((std::strcmp(args[index], "--compile-only") == 0 || std::strcmp(args[index], "-c") == 0) &&
			         !compile_only)
				compile_only = true;
			else if ((std::strcmp(args[index], "--help") == 0 || std::strcmp(args[index], "-h") == 0) &&
			         !show_help_info)
				show_help_info = true;
			else if ((std::strcmp(args[index], "--wait-before-exit") == 0 || std::strcmp(args[index], "-w") == 0) &&
			         !wait_before_exit)
				wait_before_exit = true;
			else if ((std::strcmp(args[index], "--version") == 0 || std::strcmp(args[index], "-v") == 0) &&
			         !show_version_info)
				show_version_info = true;
			else if ((std::strcmp(args[index], "--csym") == 0 || std::strcmp(args[index], "-g") == 0) &&
			         expect_csym == 0)
				expect_csym = 1;
			else if ((std::strcmp(args[index], "--log-path") == 0 || std::strcmp(args[index], "-l") == 0) &&
			         expect_log_path == 0)
				expect_log_path = 1;
			else if ((std::strcmp(args[index], "--import-path") == 0 || std::strcmp(args[index], "-i") == 0) &&
			         expect_import_path == 0)
				expect_import_path = 1;
			else if ((std::strcmp(args[index], "--stack-resize") == 0 || std::strcmp(args[index], "-S") == 0) &&
			         expect_stack_resize == 0)
				expect_stack_resize = 1;
			else
				throw cs::fatal_error("argument syntax error.");
		}
		else
			break;
	}
	if (expect_csym == 1 || expect_log_path == 1 || expect_import_path == 1 || expect_import_path == 1)
		throw cs::fatal_error("argument syntax error.");
	return index;
}